

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool jessilib::starts_with_fast<char8_t>
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string,
               u8string_view in_substring)

{
  size_type sVar1;
  size_type sVar2;
  const_iterator pvVar3;
  value_type character;
  const_iterator __end2;
  const_iterator __begin2;
  u8string_view *__range2;
  char8_t *itr;
  u8string_view in_substring_local;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_local;
  
  in_substring_local._M_str = (char8_t *)in_string._M_len;
  in_substring_local._M_len = (size_t)in_substring._M_str;
  itr = (char8_t *)in_substring._M_len;
  sVar1 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::size
                    ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                     &in_substring_local._M_str);
  sVar2 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::size
                    ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&itr);
  if (sVar1 < sVar2) {
    in_string_local._M_str._7_1_ = false;
  }
  else {
    __range2 = (u8string_view *)
               std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::data
                         ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
                          &in_substring_local._M_str);
    __end2 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::begin
                       ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&itr);
    pvVar3 = std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::end
                       ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&itr);
    for (; __end2 != pvVar3; __end2 = __end2 + 1) {
      if ((char)__range2->_M_len != *__end2) {
        return false;
      }
      __range2 = (u8string_view *)((long)&__range2->_M_len + 1);
    }
    in_string_local._M_str._7_1_ = true;
  }
  return in_string_local._M_str._7_1_;
}

Assistant:

constexpr bool starts_with_fast(std::basic_string_view<CharT> in_string, std::u8string_view in_substring) {
	if (in_string.size() < in_substring.size()) {
		return false;
	}

	const CharT* itr = in_string.data();
	for (auto character : in_substring) {
		if (*itr != character) {
			return false;
		}

		++itr;
	}

	return true;
}